

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.c
# Opt level: O3

double deFractExp(double x,int *exponent)

{
  uint in_EAX;
  double dVar1;
  int tmpExp;
  undefined8 uStack_18;
  
  uStack_18._4_4_ = 0;
  if (x < -1.79769313486232e+308 != x <= 1.79769313486232e+308) {
    uStack_18 = (ulong)in_EAX;
    dVar1 = frexp(x,(int *)((long)&uStack_18 + 4));
    uStack_18._4_4_ = uStack_18._4_4_ + -1;
    x = dVar1 + dVar1;
  }
  *exponent = uStack_18._4_4_;
  return x;
}

Assistant:

double deFractExp (double x, int* exponent)
{
	if (deIsInf(x))
	{
		*exponent = 0;
		return x;
	}
	else
	{
		int		tmpExp	= 0;
		double	fract	= frexp(x, &tmpExp);
		*exponent = tmpExp - 1;
		return fract * 2.0;
	}
}